

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_code_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  FileDescriptor *this_00;
  string *psVar1;
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  printer_00;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  Options *in_R8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view varname;
  string_view text_04;
  string_view text_05;
  string_view annotation_file;
  string_view file_name;
  string_view java_class_name;
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  printer;
  string classname;
  string filename;
  AlphaNum local_210;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string java_package;
  string info_full_path;
  string package_dir;
  string info_relative_path;
  string local_150;
  GeneratedCodeInfo annotations;
  AlphaNum local_100;
  Options local_d0;
  Options local_80;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_00;
  pointer pcVar5;
  
  this_00 = this->file_;
  Options::Options(&local_80,&this->options_);
  FileJavaPackage_abi_cxx11_
            (&java_package,(java *)this_00,(FileDescriptor *)0x1,SUB81(&local_80,0),in_R8);
  Options::~Options(&local_80);
  std::__cxx11::string::string((string *)&local_150,(string *)&java_package);
  JavaPackageToDir(&package_dir,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if ((this->options_).enforce_lite == false) {
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              (&classname,
               (this->name_resolver_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
               _M_head_impl,this->file_);
    annotations.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)package_dir._M_string_length;
    annotations.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         (intptr_t)package_dir._M_dataplus._M_p;
    local_210.piece_._M_len = classname._M_string_length;
    local_210.piece_._M_str = classname._M_dataplus._M_p;
    local_100.piece_ = absl::lts_20250127::NullSafeStringView(".java");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&filename,(lts_20250127 *)&annotations,&local_210,&local_100,(AlphaNum *)in_R8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,&filename);
    iVar4 = (*context->_vptr_GeneratorContext[2])(context,&filename);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
    GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
    annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
         (_func_int **)&PTR__AnnotationCollector_007931c8;
    annotation_collector.annotation_proto_ = &annotations;
    printer._M_t.
    super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
    .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>,_true,_true>
          )operator_new(0x130);
    annotation_collector_00 = &annotation_collector;
    if ((this->options_).annotate_code == false) {
      annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0
      ;
    }
    io::Printer::Printer
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,output,
               '$',&annotation_collector_00->super_AnnotationCollector);
    local_210.piece_._M_len = classname._M_string_length;
    local_210.piece_._M_str = classname._M_dataplus._M_p;
    local_100.piece_ = absl::lts_20250127::NullSafeStringView(".java.pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&info_relative_path,(lts_20250127 *)&local_210,&local_100,&local_100);
    local_210.piece_._M_len = filename._M_string_length;
    local_210.piece_._M_str = filename._M_dataplus._M_p;
    local_100.piece_ = absl::lts_20250127::NullSafeStringView(".pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&info_full_path,(lts_20250127 *)&local_210,&local_100,&local_100);
    psVar1 = this->file_->name_;
    local_210.piece_._M_str = (psVar1->_M_dataplus)._M_p;
    local_210.piece_._M_len = psVar1->_M_string_length;
    text._M_str = 
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
    ;
    text._M_len = 0x74;
    io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,text,
               (char (*) [9])"filename",&local_210.piece_);
    if ((this->options_).opensource_runtime == true) {
      text_00._M_str = "// Protobuf Java Version: $protobuf_java_version$\n";
      text_00._M_len = 0x32;
      io::Printer::Print<char[22],char[11]>
                ((Printer *)
                 printer._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                 .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,text_00
                 ,(char (*) [22])"protobuf_java_version",(char (*) [11])"4.31.0-dev");
    }
    text_01._M_str = "\n";
    text_01._M_len = 1;
    io::Printer::Print<>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,text_01);
    if (java_package._M_string_length != 0) {
      text_02._M_str = "package $package$;\n\n";
      text_02._M_len = 0x14;
      io::Printer::Print<char[8],std::__cxx11::string>
                ((Printer *)
                 printer._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                 .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,text_02
                 ,(char (*) [8])0x5cd2c3,&java_package);
    }
    printer_00._M_t.
    super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
    .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl =
         printer._M_t.
         super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
         .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl;
    if ((this->options_).annotate_code == true) {
      std::__cxx11::string::string((string *)&local_210,(string *)&info_relative_path);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"",(allocator<char> *)&local_100);
    }
    pcVar3 = local_210.piece_._M_str;
    sVar2 = local_210.piece_._M_len;
    Options::Options(&local_d0,&this->options_);
    annotation_file._M_str = (char *)sVar2;
    annotation_file._M_len = (size_t)pcVar3;
    PrintGeneratedAnnotation
              ((Printer *)
               printer_00._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,'$',
               annotation_file,&local_d0);
    Options::~Options(&local_d0);
    std::__cxx11::string::~string((string *)&local_210);
    text_03._M_str =
         "public final class $classname$ {\n  /* This variable is to be called by generated code only. It returns\n  * an incomplete descriptor for internal use only. */\n  public static final com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n"
    ;
    text_03._M_len = 0xf5;
    io::Printer::Print<char[10],std::__cxx11::string>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,text_03,
               (char (*) [10])0x475c54,&classname);
    psVar1 = this->file_->name_;
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    varname._M_str = "classname";
    varname._M_len = 9;
    file_name._M_str = pcVar5;
    file_name._M_len = psVar1->_M_string_length;
    io::Printer::Annotate
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,varname,
               file_name,(optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_04._M_str = "  static {\n";
    text_04._M_len = 0xb;
    io::Printer::Print<>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,text_04);
    *(long *)((long)printer._M_t.
                    super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                    .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl +
             0x68) =
         *(long *)((long)printer._M_t.
                         super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                         .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl
                  + 0x68) +
         *(long *)((long)printer._M_t.
                         super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                         .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl
                  + 0x58) * 2;
    GenerateDescriptors(this,(Printer *)
                             printer._M_t.
                             super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                             .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>.
                             _M_head_impl);
    java_class_name._M_str = pcVar5;
    java_class_name._M_len = (size_t)classname._M_dataplus._M_p;
    PrintGencodeVersionValidator
              ((java *)printer._M_t.
                       super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                       .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,
               (Printer *)(ulong)(this->options_).opensource_runtime,
               (bool)(undefined1)classname._M_string_length,java_class_name);
    io::Printer::Outdent
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl);
    io::Printer::Outdent
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl);
    text_05._M_str = "  }\n}\n";
    text_05._M_len = 6;
    io::Printer::Print<>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,text_05);
    if ((this->options_).annotate_code == true) {
      iVar4 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
      output_00 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,output_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(annotation_file_list,&info_full_path);
      if (output_00 != (ZeroCopyOutputStream *)0x0) {
        (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
      }
    }
    std::
    __uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
    ::reset((__uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             *)&printer,(pointer)0x0);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])();
    }
    std::__cxx11::string::~string((string *)&info_full_path);
    std::__cxx11::string::~string((string *)&info_relative_path);
    std::
    unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>::
    ~unique_ptr(&printer);
    GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&classname);
  }
  std::__cxx11::string::~string((string *)&package_dir);
  std::__cxx11::string::~string((string *)&java_package);
  return;
}

Assistant:

void SharedCodeGenerator::Generate(
    GeneratorContext* context, std::vector<std::string>* file_list,
    std::vector<std::string>* annotation_file_list) {
  std::string java_package = FileJavaPackage(file_, true, options_);
  std::string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    std::string classname = name_resolver_->GetDescriptorClassName(file_);
    std::string filename = absl::StrCat(package_dir, classname, ".java");
    file_list->push_back(filename);
    std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::unique_ptr<io::Printer> printer(new io::Printer(
        output.get(), '$',
        options_.annotate_code ? &annotation_collector : nullptr));
    std::string info_relative_path = absl::StrCat(classname, ".java.pb.meta");
    std::string info_full_path = absl::StrCat(filename, ".pb.meta");
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// NO CHECKED-IN PROTOBUF "
        // Intentional line breaker
        "GENCODE\n"
        "// source: $filename$\n",
        "filename", file_->name());
    if (options_.opensource_runtime) {
      printer->Print("// Protobuf Java Version: $protobuf_java_version$\n",
                     "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
    }
    printer->Print("\n");
    if (!java_package.empty()) {
      printer->Print(
          "package $package$;\n"
          "\n",
          "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "",
                             options_);


    printer->Print(

        "public final class $classname$ {\n"
        "  /* This variable is to be called by generated code only. It "
        "returns\n"
        "  * an incomplete descriptor for internal use only. */\n"
        "  public static final com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());


    printer->Print("  static {\n");
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    PrintGencodeVersionValidator(printer.get(), options_.opensource_runtime,
                                 classname);
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");

    if (options_.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}